

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void RestoreState(VP8LDecoder *dec)

{
  VP8LColorCache *in_RDI;
  
  *(undefined4 *)&in_RDI->colors_ = 5;
  memcpy(&in_RDI[2].hash_shift_,&in_RDI[5].hash_shift_,0x28);
  *(undefined4 *)&in_RDI[9].colors_ = *(undefined4 *)&in_RDI[8].colors_;
  if (0 < in_RDI[9].hash_shift_) {
    VP8LColorCacheCopy((VP8LColorCache *)dec,in_RDI);
  }
  return;
}

Assistant:

static void RestoreState(VP8LDecoder* const dec) {
  assert(dec->br_.eos_);
  dec->status_ = VP8_STATUS_SUSPENDED;
  dec->br_ = dec->saved_br_;
  dec->last_pixel_ = dec->saved_last_pixel_;
  if (dec->hdr_.color_cache_size_ > 0) {
    VP8LColorCacheCopy(&dec->hdr_.saved_color_cache_, &dec->hdr_.color_cache_);
  }
}